

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t
check_bad_attrsz(_internal_exr_seq_scratch *scratch,int32_t attrsz,int32_t eltsize,char *aname,
                char *tname,int32_t *outsz)

{
  long lVar1;
  exr_result_t eVar2;
  undefined8 in_RAX;
  ulong uVar3;
  char *pcVar4;
  exr_const_context_t p_Var5;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  *outsz = attrsz;
  if (attrsz < 0) {
    p_Var5 = scratch->ctxt;
    UNRECOVERED_JUMPTABLE = p_Var5->print_error;
    pcVar4 = "Attribute \'%s\', type \'%s\': Invalid negative size %d";
  }
  else {
    uVar3 = (ulong)(uint)attrsz;
    lVar1 = scratch->navail;
    p_Var5 = scratch->ctxt;
    if ((uVar3 - lVar1 == 0 || (long)uVar3 < lVar1) || p_Var5->file_size < 1) {
      if (attrsz != 0x7fffffff || (long)uVar3 <= lVar1) goto LAB_00127a99;
    }
    else if ((long)((uVar3 - lVar1) + scratch->fileoff) <= p_Var5->file_size) {
LAB_00127a99:
      if (1 < eltsize) {
        if (eltsize * ((uint)attrsz / (uint)eltsize) != attrsz) {
          eVar2 = (*p_Var5->print_error)
                            (p_Var5,0x11,
                             "Attribute \'%s\': Invalid size %d (exp \'%s\' size 4 * n, found odd bytes %d)"
                             ,aname,(ulong)(uint)attrsz,tname,
                             CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)attrsz % (uint)eltsize));
          return eVar2;
        }
        *outsz = (uint)attrsz / (uint)eltsize;
      }
      return 0;
    }
    UNRECOVERED_JUMPTABLE = p_Var5->print_error;
    pcVar4 = "Attribute \'%s\', type \'%s\': Invalid size %d";
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(p_Var5,0x11,pcVar4,aname,tname,(ulong)(uint)attrsz);
  return eVar2;
}

Assistant:

static exr_result_t
check_bad_attrsz (
    struct _internal_exr_seq_scratch* scratch,
    int32_t                           attrsz,
    int32_t                           eltsize,
    const char*                       aname,
    const char*                       tname,
    int32_t*                          outsz)
{
    int32_t n = attrsz;

    *outsz = n;
    if (attrsz < 0)
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid negative size %d",
            aname,
            tname,
            attrsz);

    if (scratch_attr_too_big (scratch, attrsz))
        return scratch->ctxt->print_error (
            scratch->ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid size %d",
            aname,
            tname,
            attrsz);

    if (eltsize > 1)
    {
        n = attrsz / eltsize;
        if (attrsz != (int32_t) (n * eltsize))
            return scratch->ctxt->print_error (
                scratch->ctxt,
                EXR_ERR_ATTR_SIZE_MISMATCH,
                "Attribute '%s': Invalid size %d (exp '%s' size 4 * n, found odd bytes %d)",
                aname,
                attrsz,
                tname,
                (attrsz % eltsize));
        *outsz = n;
    }

    return EXR_ERR_SUCCESS;
}